

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

void __thiscall acto::core::runtime_t::execute(runtime_t *this)

{
  mpsc_stack<acto::core::worker_t> *this_00;
  sequence<acto::core::worker_t> item;
  bool bVar1;
  __pid_t _Var2;
  object_t *obj;
  long lVar3;
  worker_t *pwVar4;
  void *__stat_loc;
  long lVar5;
  long local_58;
  sequence<acto::core::worker_t> idle_workers;
  anon_class_8_1_8991fb9c delete_worker;
  
  local_58 = std::chrono::_V2::steady_clock::now();
  this_00 = &(this->workers_).idle;
  lVar5 = 2;
  delete_worker.this = this;
  do {
    if (((this->active_)._M_base._M_i & 1U) == 0) {
      return;
    }
LAB_00152afc:
    while (bVar1 = intrusive::queue<acto::core::object_t,_acto::intrusive::spin_lock>::empty
                             (&this->queue_), !bVar1) {
      pwVar4 = intrusive::mpsc_stack<acto::core::worker_t>::pop(this_00);
      if (pwVar4 != (worker_t *)0x0) goto LAB_00152a6c;
      if ((this->workers_).count.super___atomic_base<unsigned_long>._M_i <
          (this->workers_).reserved.super___atomic_base<unsigned_long>._M_i + this->m_processors) {
LAB_00152a61:
        pwVar4 = create_worker(this);
        goto LAB_00152a6c;
      }
      __stat_loc = (void *)(lVar5 * 1000000000);
      _Var2 = event::wait(&this->idle_workers_event_,__stat_loc);
      pwVar4 = intrusive::mpsc_stack<acto::core::worker_t>::pop(this_00);
      if (_Var2 != 2 || pwVar4 != (worker_t *)0x0) goto LAB_00152ae7;
      lVar5 = lVar5 + 2;
      if ((this->workers_).count.super___atomic_base<unsigned_long>._M_i < 0x200) goto LAB_00152a61;
      event::wait(&this->idle_workers_event_,__stat_loc);
    }
    if ((((this->terminating_)._M_base._M_i & 1U) == 0) &&
       (_Var2 = event::wait(&this->queue_event_,(void *)0xdf8475800), _Var2 != 2)) {
      lVar3 = std::chrono::_V2::steady_clock::now();
      if (60000000000 < lVar3 - local_58) {
        pwVar4 = intrusive::mpsc_stack<acto::core::worker_t>::pop(this_00);
        if (pwVar4 != (worker_t *)0x0) {
          execute::anon_class_8_1_8991fb9c::operator()(&delete_worker,pwVar4);
        }
        local_58 = std::chrono::_V2::steady_clock::now();
      }
    }
    else {
      intrusive::mpsc_stack<acto::core::worker_t>::extract
                ((mpsc_stack<acto::core::worker_t> *)&idle_workers);
      while (item.head_ = idle_workers.head_, idle_workers.head_ != (worker_t *)0x0) {
        pwVar4 = ((idle_workers.head_)->super_node<acto::core::worker_t>).next;
        ((idle_workers.head_)->super_node<acto::core::worker_t>).next = (worker_t *)0x0;
        idle_workers.head_ = pwVar4;
        execute::anon_class_8_1_8991fb9c::operator()(&delete_worker,item.head_);
      }
    }
  } while( true );
LAB_00152ae7:
  if (2 < lVar5) {
    lVar5 = lVar5 + -2;
  }
  if (pwVar4 != (worker_t *)0x0) {
LAB_00152a6c:
    obj = intrusive::queue<acto::core::object_t,_acto::intrusive::spin_lock>::pop(&this->queue_);
    if (obj == (object_t *)0x0) {
      intrusive::mpsc_stack<acto::core::worker_t>::push(this_00,pwVar4);
    }
    else {
      worker_t::assign(pwVar4,obj,(duration)0x1dcd6500);
    }
  }
  goto LAB_00152afc;
}

Assistant:

void runtime_t::execute() {
  auto last_cleanup_time = std::chrono::steady_clock::now();
  auto new_worker_timeout = std::chrono::seconds(2);

  auto delete_worker = [this](worker_t* const item) {
    delete item;
    // Уведомить, что удалены все вычислительные потоки
    if (--workers_.count == 0) {
      no_workers_event_.signaled();
    }
  };

  while (active_) {
    while (!queue_.empty()) {
      // Прежде чем извлекать объект из очереди, необходимо проверить,
      // что есть вычислительные ресурсы для его обработки
      worker_t* worker = workers_.idle.pop();

      if (!worker) {
        // Если текущее количество потоков меньше оптимального,
        // то создать новый поток
        if (workers_.count < (workers_.reserved + m_processors)) {
          worker = create_worker();
        } else {
          // Подождать некоторое время осовобождения какого-нибудь потока
          const wait_result result =
            idle_workers_event_.wait(new_worker_timeout);

          worker = workers_.idle.pop();

          if (!worker && (result == wait_result::timeout)) {
            new_worker_timeout += std::chrono::seconds(2);

            if (workers_.count < MAX_WORKERS) {
              worker = create_worker();
            } else {
              idle_workers_event_.wait();
            }
          } else if (new_worker_timeout > std::chrono::seconds(2)) {
            new_worker_timeout -= std::chrono::seconds(2);
          }
        }
      }

      if (worker) {
        if (object_t* const obj = queue_.pop()) {
          worker->assign(obj, std::chrono::milliseconds(500));
        } else {
          workers_.idle.push(worker);
        }
      }
    }

    if (terminating_ ||
        (queue_event_.wait(std::chrono::seconds(60)) == wait_result::timeout))
    {
      auto idle_workers = workers_.idle.extract();
      // Stop all idle threads.
      while (worker_t* const item = idle_workers.pop_front()) {
        delete_worker(item);
      }
    } else if ((std::chrono::steady_clock::now() - last_cleanup_time) >
               std::chrono::seconds(60))
    {
      if (worker_t* const item = workers_.idle.pop()) {
        delete_worker(item);
      }

      last_cleanup_time = std::chrono::steady_clock::now();
    }
  }
}